

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
          (string *__return_storage_ptr__,MatcherUntypedBase *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  MatcherUntypedBase *local_18;
  MatcherUntypedBase *this_local;
  
  local_18 = this;
  this_local = (MatcherUntypedBase *)__return_storage_ptr__;
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty(&this->m_cachedToString);
  if (bVar1) {
    (*this->_vptr_MatcherUntypedBase[2])(&local_38);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(&this->m_cachedToString,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_cachedToString);
  return __return_storage_ptr__;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
            if( m_cachedToString.empty() )
                m_cachedToString = describe();
            return m_cachedToString;
        }